

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenGetterForLookupByKey
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def,
          FieldDef *key_field,string *data_buffer,string *offset)

{
  __type _Var1;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_58 [8];
  string name;
  string *offset_local;
  string *data_buffer_local;
  FieldDef *key_field_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  name.field_2._8_8_ = offset;
  Name_abi_cxx11_((string *)local_58,this,key_field);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)struct_def);
  if (_Var1) {
    std::__cxx11::string::operator+=((string *)local_58,"_");
  }
  GetObjectConstructor(&local_a8,this,struct_def,data_buffer,(string *)name.field_2._8_8_);
  std::operator+(&local_88,&local_a8,".");
  std::operator+(__return_storage_ptr__,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetterForLookupByKey(flatbuffers::StructDef &struct_def,
                                      flatbuffers::FieldDef *key_field,
                                      const std::string &data_buffer,
                                      const std::string &offset) const {
    // Use the generated type directly, to properly handle default values that
    // might not be written to the buffer.
    auto name = Name(*key_field);
    if (name == struct_def.name) { name += "_"; }
    return GetObjectConstructor(struct_def, data_buffer, offset) + "." + name;
  }